

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime_s.c
# Opt level: O1

int main(void)

{
  errno_t eVar1;
  tm *ptVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  time_t t;
  char s [27];
  tm tm;
  time_t local_50;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char cStack_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  tm local_24;
  
  local_50 = -0x80000000;
  ptVar2 = localtime_s(&local_50,&local_24);
  eVar1 = asctime_s(&local_48,0x1b,ptVar2);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/ctime_s.c, line %d - %s\n"
           ,0x32,"ctime_s( s, 27, &t ) == 0");
  }
  auVar5[0] = -(cStack_3e == ' ');
  auVar5[1] = -(cStack_3d == '2');
  auVar5[2] = -(cStack_3c == '1');
  auVar5[3] = -(cStack_3b == ':');
  auVar5[4] = -(cStack_3a == '4');
  auVar5[5] = -(cStack_39 == '5');
  auVar5[6] = -(cStack_38 == ':');
  auVar5[7] = -(cStack_37 == '5');
  auVar5[8] = -(cStack_36 == '2');
  auVar5[9] = -(cStack_35 == ' ');
  auVar5[10] = -(cStack_34 == '1');
  auVar5[0xb] = -(cStack_33 == '9');
  auVar5[0xc] = -(cStack_32 == '0');
  auVar5[0xd] = -(cStack_31 == '1');
  auVar5[0xe] = -(cStack_30 == '\n');
  auVar5[0xf] = -(cStack_2f == '\0');
  auVar3[0] = -(local_48 == 'F');
  auVar3[1] = -(cStack_47 == 'r');
  auVar3[2] = -(cStack_46 == 'i');
  auVar3[3] = -(cStack_45 == ' ');
  auVar3[4] = -(cStack_44 == 'D');
  auVar3[5] = -(cStack_43 == 'e');
  auVar3[6] = -(cStack_42 == 'c');
  auVar3[7] = -(cStack_41 == ' ');
  auVar3[8] = -(cStack_40 == '1');
  auVar3[9] = -(cStack_3f == '3');
  auVar3[10] = -(cStack_3e == ' ');
  auVar3[0xb] = -(cStack_3d == '2');
  auVar3[0xc] = -(cStack_3c == '1');
  auVar3[0xd] = -(cStack_3b == ':');
  auVar3[0xe] = -(cStack_3a == '4');
  auVar3[0xf] = -(cStack_39 == '5');
  auVar3 = auVar3 & auVar5;
  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) != 0xffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/ctime_s.c, line %d - %s\n"
           ,0x33,"strcmp( s, \"Fri Dec 13 21:45:52 1901\\n\" ) == 0");
  }
  local_50 = 0x7fffffff;
  ptVar2 = localtime_s(&local_50,&local_24);
  eVar1 = asctime_s(&local_48,0x1b,ptVar2);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/ctime_s.c, line %d - %s\n"
           ,0x36,"ctime_s( s, 27, &t ) == 0");
  }
  auVar6[0] = -(cStack_3e == ' ');
  auVar6[1] = -(cStack_3d == '0');
  auVar6[2] = -(cStack_3c == '4');
  auVar6[3] = -(cStack_3b == ':');
  auVar6[4] = -(cStack_3a == '1');
  auVar6[5] = -(cStack_39 == '4');
  auVar6[6] = -(cStack_38 == ':');
  auVar6[7] = -(cStack_37 == '0');
  auVar6[8] = -(cStack_36 == '7');
  auVar6[9] = -(cStack_35 == ' ');
  auVar6[10] = -(cStack_34 == '2');
  auVar6[0xb] = -(cStack_33 == '0');
  auVar6[0xc] = -(cStack_32 == '3');
  auVar6[0xd] = -(cStack_31 == '8');
  auVar6[0xe] = -(cStack_30 == '\n');
  auVar6[0xf] = -(cStack_2f == '\0');
  auVar4[0] = -(local_48 == 'T');
  auVar4[1] = -(cStack_47 == 'u');
  auVar4[2] = -(cStack_46 == 'e');
  auVar4[3] = -(cStack_45 == ' ');
  auVar4[4] = -(cStack_44 == 'J');
  auVar4[5] = -(cStack_43 == 'a');
  auVar4[6] = -(cStack_42 == 'n');
  auVar4[7] = -(cStack_41 == ' ');
  auVar4[8] = -(cStack_40 == '1');
  auVar4[9] = -(cStack_3f == '9');
  auVar4[10] = -(cStack_3e == ' ');
  auVar4[0xb] = -(cStack_3d == '0');
  auVar4[0xc] = -(cStack_3c == '4');
  auVar4[0xd] = -(cStack_3b == ':');
  auVar4[0xe] = -(cStack_3a == '1');
  auVar4[0xf] = -(cStack_39 == '4');
  auVar4 = auVar4 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/ctime_s.c, line %d - %s\n"
           ,0x37,"strcmp( s, \"Tue Jan 19 04:14:07 2038\\n\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* TODO: System Clock DST */
    time_t t;
    char s[27];

    /* TODO: Constraint handling */

    t = -2147483648l;
    TESTCASE( ctime_s( s, 27, &t ) == 0 );
    TESTCASE( strcmp( s, "Fri Dec 13 21:45:52 1901\n" ) == 0 );

    t = 2147483647l;
    TESTCASE( ctime_s( s, 27, &t ) == 0 );
    TESTCASE( strcmp( s, "Tue Jan 19 04:14:07 2038\n" ) == 0 );
#endif

    return TEST_RESULTS;
}